

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::STLImporter::pushMeshesToNode
          (STLImporter *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshIndices,
          aiNode *node)

{
  pointer puVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  
  if (node != (aiNode *)0x0) {
    puVar1 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      node->mNumMeshes = (uint)((ulong)((long)puVar2 - (long)puVar1) >> 2);
      uVar3 = (long)(meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (long)uVar3) {
        uVar5 = uVar3;
      }
      puVar4 = (uint *)operator_new__(uVar5);
      node->mMeshes = puVar4;
      uVar5 = 0;
      while( true ) {
        puVar1 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)puVar2 - (long)puVar1 >> 2) <= uVar5) break;
        node->mMeshes[uVar5] = puVar1[uVar5];
        uVar5 = uVar5 + 1;
      }
      if (puVar2 != puVar1) {
        (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
    }
    return;
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/STL/STLLoader.cpp"
                ,0x239,
                "void Assimp::STLImporter::pushMeshesToNode(std::vector<unsigned int> &, aiNode *)")
  ;
}

Assistant:

void STLImporter::pushMeshesToNode( std::vector<unsigned int> &meshIndices, aiNode *node ) {
    ai_assert( nullptr != node );
    if ( meshIndices.empty() ) {
        return;
    }

    node->mNumMeshes = static_cast<unsigned int>( meshIndices.size() );
    node->mMeshes = new unsigned int[ meshIndices.size() ];
    for ( size_t i=0; i<meshIndices.size(); ++i ) {
        node->mMeshes[ i ] = meshIndices[ i ];
    }
    meshIndices.clear();
}